

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_split.hpp
# Opt level: O0

b_str<char32_t> *
detail::operator|(b_str<char32_t> *__return_storage_ptr__,b_str<char32_t> *str,
                 split_helper_subroutine<detail::split_at_first_back,_const_char32_t_*,_char32_t>
                 *info)

{
  size_type sVar1;
  size_t pos;
  split_helper_subroutine<detail::split_at_first_back,_const_char32_t_*,_char32_t> *info_local;
  b_str<char32_t> *str_local;
  
  sVar1 = std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
          find_first_of(str,info->delim,0);
  if (sVar1 == 0xffffffffffffffff) {
    std::__cxx11::u32string::u32string((u32string *)__return_storage_ptr__);
  }
  else {
    sVar1 = std::__cxx11::
            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
            find_first_not_of(str,info->delim,sVar1);
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    erase(str,0,sVar1);
    std::__cxx11::u32string::u32string((u32string *)__return_storage_ptr__,str);
  }
  return __return_storage_ptr__;
}

Assistant:

b_str<CharType> operator| (b_str<CharType>&& str, const split_helper_subroutine<split_at_first_back, DelimType, CharType>& info)
	{
		const std::size_t pos = str.find_first_of(info.delim);
		if (b_str<CharType>::npos == pos) return {};
		str.erase(0, str.find_first_not_of(info.delim, pos));
		return std::move(str);
	}